

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void op_http_conn_read_rate_update(OpusHTTPConn *_conn)

{
  long lVar1;
  int local_3c;
  opus_int64 read_rate;
  opus_int64 read_delta_bytes;
  undefined1 auStack_20 [4];
  opus_int32 read_delta_ms;
  op_time read_time;
  OpusHTTPConn *_conn_local;
  
  lVar1 = _conn->read_bytes;
  if (0 < lVar1) {
    read_time.tv_nsec = (__syscall_slong_t)_conn;
    op_time_get((op_time *)auStack_20);
    local_3c = op_time_diff_ms((op_time *)auStack_20,(op_time *)(read_time.tv_nsec + 0x30));
    if (local_3c < 2) {
      local_3c = 1;
    }
    *(__time_t *)(read_time.tv_nsec + 0x30) = _auStack_20;
    *(__time_t *)(read_time.tv_nsec + 0x38) = read_time.tv_sec;
    *(undefined8 *)(read_time.tv_nsec + 0x40) = 0;
    *(long *)(read_time.tv_nsec + 0x48) =
         (((lVar1 * 1000) / (long)local_3c - *(long *)(read_time.tv_nsec + 0x48)) + 4 >> 3) +
         *(long *)(read_time.tv_nsec + 0x48);
  }
  return;
}

Assistant:

static void op_http_conn_read_rate_update(OpusHTTPConn *_conn){
  op_time      read_time;
  opus_int32   read_delta_ms;
  opus_int64   read_delta_bytes;
  opus_int64   read_rate;
  read_delta_bytes=_conn->read_bytes;
  if(read_delta_bytes<=0)return;
  op_time_get(&read_time);
  read_delta_ms=op_time_diff_ms(&read_time,&_conn->read_time);
  read_rate=_conn->read_rate;
  read_delta_ms=OP_MAX(read_delta_ms,1);
  read_rate+=read_delta_bytes*1000/read_delta_ms-read_rate+4>>3;
  *&_conn->read_time=*&read_time;
  _conn->read_bytes=0;
  _conn->read_rate=read_rate;
}